

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool op_store_rr(DisasContext_conflict1 *s,arg_ldst_rr *a,MemOp mop,int mem_idx)

{
  TCGContext_conflict1 *s_00;
  undefined1 extraout_AL;
  TCGv_i32 a32;
  TCGv_i32 val;
  ISSInfo IVar1;
  uintptr_t o;
  
  s_00 = s->uc->tcg_ctx;
  IVar1 = ISSIsWrite|ISSInvalid;
  if ((a->p != 0) && (a->w == 0)) {
    IVar1 = a->rt | ISSIs16Bit;
    if ((s->base).pc_next - s->pc_curr != 2) {
      IVar1 = a->rt;
    }
    IVar1 = IVar1 | ISSIsWrite;
  }
  a32 = op_addr_rr_pre(s,a);
  val = load_reg(s,a->rt);
  gen_aa32_st_i32(s,val,a32,mem_idx,s->be_data | mop);
  disas_set_da_iss(s,mop,IVar1);
  tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(val + (long)s_00));
  op_addr_rr_post(s,a,a32,0);
  return (_Bool)extraout_AL;
}

Assistant:

static bool op_store_rr(DisasContext *s, arg_ldst_rr *a,
                        MemOp mop, int mem_idx)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    ISSInfo issinfo = make_issinfo(s, a->rt, a->p, a->w) | ISSIsWrite;
    TCGv_i32 addr, tmp;

    addr = op_addr_rr_pre(s, a);

    tmp = load_reg(s, a->rt);
    gen_aa32_st_i32(s, tmp, addr, mem_idx, mop | s->be_data);
    disas_set_da_iss(s, mop, issinfo);
    tcg_temp_free_i32(tcg_ctx, tmp);

    op_addr_rr_post(s, a, addr, 0);
    return true;
}